

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpanel_dfs.c
# Opt level: O0

void zpanel_dfs(int m,int w,int jcol,SuperMatrix *A,int *perm_r,int *nseg,doublecomplex *dense,
               int *panel_lsub,int *segrep,int *repfnz,int_t *xprune,int *marker,int *parent,
               int_t *xplore,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  int_t *piVar10;
  int_t *piVar11;
  int iVar12;
  double *pdVar13;
  int local_d8;
  int local_d4;
  int_t maxdfs;
  int_t xdfs;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  doublecomplex *pdStack_a8;
  int_t nextl_col;
  doublecomplex *dense_col;
  int *repfnz_col;
  int *marker1;
  int jj;
  int kpar;
  int myfnz;
  int kchild;
  int oldrep;
  int chrep;
  int chmark;
  int chperm;
  int krep;
  int kperm;
  int kmark;
  int krow;
  int_t k;
  int_t *xa_end;
  int_t *xa_begin;
  int_t *asub;
  doublecomplex *a;
  NCPformat *Astore;
  int *nseg_local;
  int *perm_r_local;
  SuperMatrix *A_local;
  int jcol_local;
  int w_local;
  int m_local;
  
  pvVar3 = A->Store;
  lVar4 = *(long *)((long)pvVar3 + 8);
  lVar5 = *(long *)((long)pvVar3 + 0x10);
  lVar6 = *(long *)((long)pvVar3 + 0x18);
  lVar7 = *(long *)((long)pvVar3 + 0x20);
  dense_col = (doublecomplex *)repfnz;
  pdStack_a8 = dense;
  *nseg = 0;
  piVar8 = Glu->xsup;
  piVar9 = Glu->supno;
  piVar10 = Glu->lsub;
  piVar11 = Glu->xlsub;
  marker1._4_4_ = jcol;
  do {
    if (jcol + w <= marker1._4_4_) {
      return;
    }
    xsup._4_4_ = (marker1._4_4_ - jcol) * m;
    for (kmark = *(int *)(lVar6 + (long)marker1._4_4_ * 4);
        kmark < *(int *)(lVar7 + (long)marker1._4_4_ * 4); kmark = kmark + 1) {
      iVar1 = *(int *)(lVar5 + (long)kmark * 4);
      pdVar13 = (double *)(lVar4 + (long)kmark * 0x10);
      pdStack_a8[iVar1].r = *pdVar13;
      pdStack_a8[iVar1].i = pdVar13[1];
      if (marker[iVar1] != marker1._4_4_) {
        marker[iVar1] = marker1._4_4_;
        iVar2 = perm_r[iVar1];
        if (iVar2 == -1) {
          panel_lsub[xsup._4_4_] = iVar1;
          xsup._4_4_ = xsup._4_4_ + 1;
        }
        else {
          chmark = piVar8[piVar9[iVar2] + 1] + -1;
          iVar1 = *(int *)((long)&dense_col->r + (long)chmark * 4);
          if (iVar1 == -1) {
            parent[chmark] = -1;
            *(int *)((long)&dense_col->r + (long)chmark * 4) = iVar2;
            local_d4 = piVar11[chmark];
            local_d8 = xprune[chmark];
            do {
              while (local_d4 < local_d8) {
                iVar1 = piVar10[local_d4];
                local_d4 = local_d4 + 1;
                if (marker[iVar1] != marker1._4_4_) {
                  marker[iVar1] = marker1._4_4_;
                  iVar2 = perm_r[iVar1];
                  if (iVar2 == -1) {
                    panel_lsub[xsup._4_4_] = iVar1;
                    xsup._4_4_ = xsup._4_4_ + 1;
                  }
                  else {
                    iVar12 = piVar8[piVar9[iVar2] + 1] + -1;
                    iVar1 = *(int *)((long)&dense_col->r + (long)iVar12 * 4);
                    if (iVar1 == -1) {
                      xplore[chmark] = local_d4;
                      parent[iVar12] = chmark;
                      *(int *)((long)&dense_col->r + (long)iVar12 * 4) = iVar2;
                      local_d4 = piVar11[iVar12];
                      local_d8 = xprune[iVar12];
                      chmark = iVar12;
                    }
                    else if (iVar2 < iVar1) {
                      *(int *)((long)&dense_col->r + (long)iVar12 * 4) = iVar2;
                    }
                  }
                }
              }
              if (marker[(long)m + (long)chmark] < jcol) {
                segrep[*nseg] = chmark;
                *nseg = *nseg + 1;
                marker[(long)m + (long)chmark] = marker1._4_4_;
              }
              chmark = parent[chmark];
              if (chmark == -1) break;
              local_d4 = xplore[chmark];
              local_d8 = xprune[chmark];
            } while (chmark != -1);
          }
          else if (iVar2 < iVar1) {
            *(int *)((long)&dense_col->r + (long)chmark * 4) = iVar2;
          }
        }
      }
    }
    dense_col = (doublecomplex *)((long)&dense_col->r + (long)m * 4);
    pdStack_a8 = pdStack_a8 + m;
    marker1._4_4_ = marker1._4_4_ + 1;
  } while( true );
}

Assistant:

void
zpanel_dfs (
	   const int  m,           /* in - number of rows in the matrix */
	   const int  w,           /* in */
	   const int  jcol,        /* in */
	   SuperMatrix *A,       /* in - original matrix */
	   int        *perm_r,     /* in */
	   int        *nseg,	   /* out */
	   doublecomplex     *dense,      /* out */
	   int        *panel_lsub, /* out */
	   int        *segrep,     /* out */
	   int        *repfnz,     /* out */
	   int_t      *xprune,     /* out */
	   int        *marker,     /* out */     
	   int        *parent,     /* working array */
	   int_t      *xplore,     /* working array */
	   GlobalLU_t *Glu         /* modified */
	   )
{

    NCPformat *Astore;
    doublecomplex    *a;
    int_t     *asub;
    int_t     *xa_begin, *xa_end, k;
    int       krow, kmark, kperm;
    int	      krep, chperm, chmark, chrep, oldrep, kchild, myfnz, kpar;
    int       jj;	   /* index through each column in the panel */
    int       *marker1;	   /* marker1[jj] >= jcol if vertex jj was visited 
			      by a previous column within this panel.   */
    int       *repfnz_col; /* start of each column in the panel */
    doublecomplex    *dense_col;  /* start of each column in the panel */
    int_t     nextl_col;   /* next available position in panel_lsub[*,jj] */
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    int_t      xdfs, maxdfs;

    /* Initialize pointers */
    Astore     = A->Store;
    a          = Astore->nzval;
    asub       = Astore->rowind;
    xa_begin   = Astore->colbeg;
    xa_end     = Astore->colend;
    marker1    = marker + m;
    repfnz_col = repfnz;
    dense_col  = dense;
    *nseg      = 0;
    xsup       = Glu->xsup;
    supno      = Glu->supno;
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;

    /* For each column in the panel */
    for (jj = jcol; jj < jcol + w; jj++) {
	nextl_col = (jj - jcol) * m;

#ifdef CHK_DFS
	printf("\npanel col %d: ", jj);
#endif

	/* For each nonz in A[*,jj] do dfs */
	for (k = xa_begin[jj]; k < xa_end[jj]; k++) {
	    krow = asub[k];
            dense_col[krow] = a[k];
	    kmark = marker[krow];    	
	    if ( kmark == jj ) 
		continue;     /* krow visited before, go to the next nonzero */

	    /* For each unmarked nbr krow of jj
	     * krow is in L: place it in structure of L[*,jj]
	     */
	    marker[krow] = jj;
	    kperm = perm_r[krow];
	    
	    if ( kperm == SLU_EMPTY ) {
		panel_lsub[nextl_col++] = krow; /* krow is indexed into A */
	    }
	    /* 
	     * krow is in U: if its supernode-rep krep
	     * has been explored, update repfnz[*]
	     */
	    else {
		
		krep = xsup[supno[kperm]+1] - 1;
		myfnz = repfnz_col[krep];
		
#ifdef CHK_DFS
		printf("krep %d, myfnz %d, perm_r[%d] %d\n", krep, myfnz, krow, kperm);
#endif
		if ( myfnz != SLU_EMPTY ) {	/* Representative visited before */
		    if ( myfnz > kperm ) repfnz_col[krep] = kperm;
		    /* continue; */
		}
		else {
		    /* Otherwise, perform dfs starting at krep */
		    oldrep = SLU_EMPTY;
		    parent[krep] = oldrep;
		    repfnz_col[krep] = kperm;
		    xdfs = xlsub[krep];
		    maxdfs = xprune[krep];
		    
#ifdef CHK_DFS 
		    printf("  xdfs %d, maxdfs %d: ", xdfs, maxdfs);
		    for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);
		    printf("\n");
#endif
		    do {
			/* 
			 * For each unmarked kchild of krep 
			 */
			while ( xdfs < maxdfs ) {
			    
			    kchild = lsub[xdfs];
			    xdfs++;
			    chmark = marker[kchild];
			    
			    if ( chmark != jj ) { /* Not reached yet */
				marker[kchild] = jj;
				chperm = perm_r[kchild];
			      
				/* Case kchild is in L: place it in L[*,j] */
				if ( chperm == SLU_EMPTY ) {
				    panel_lsub[nextl_col++] = kchild;
				} 
				/* Case kchild is in U: 
				 *   chrep = its supernode-rep. If its rep has 
				 *   been explored, update its repfnz[*]
				 */
				else {
				    
				    chrep = xsup[supno[chperm]+1] - 1;
				    myfnz = repfnz_col[chrep];
#ifdef CHK_DFS
				    printf("chrep %d,myfnz %d,perm_r[%d] %d\n",chrep,myfnz,kchild,chperm);
#endif
				    if ( myfnz != SLU_EMPTY ) { /* Visited before */
					if ( myfnz > chperm )
					    repfnz_col[chrep] = chperm;
				    }
				    else {
					/* Cont. dfs at snode-rep of kchild */
					xplore[krep] = xdfs;	
					oldrep = krep;
					krep = chrep; /* Go deeper down G(L) */
					parent[krep] = oldrep;
					repfnz_col[krep] = chperm;
					xdfs = xlsub[krep];     
					maxdfs = xprune[krep];
#ifdef CHK_DFS 
					printf("  xdfs %d, maxdfs %d: ", xdfs, maxdfs);
					for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);	
					printf("\n");
#endif
				    } /* else */
				  
				} /* else */
			      
			    } /* if... */
			    
			} /* while xdfs < maxdfs */
			
			/* krow has no more unexplored nbrs:
			 *    Place snode-rep krep in postorder DFS, if this 
			 *    segment is seen for the first time. (Note that
			 *    "repfnz[krep]" may change later.)
			 *    Backtrack dfs to its parent.
			 */
			if ( marker1[krep] < jcol ) {
			    segrep[*nseg] = krep;
			    ++(*nseg);
			    marker1[krep] = jj;
			}
			
			kpar = parent[krep]; /* Pop stack, mimic recursion */
			if ( kpar == SLU_EMPTY ) break; /* dfs done */
			krep = kpar;
			xdfs = xplore[krep];
			maxdfs = xprune[krep];
			
#ifdef CHK_DFS 
			printf("  pop stack: krep %d,xdfs %d,maxdfs %d: ", krep,xdfs,maxdfs);
			for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);
			printf("\n");
#endif
		    } while ( kpar != SLU_EMPTY ); /* do-while - until empty stack */
		    
		} /* else */
		
	    } /* else */
	    
	} /* for each nonz in A[*,jj] */
	
	repfnz_col += m;    /* Move to next column */
        dense_col += m;
	
    } /* for jj ... */
    
}